

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

void __thiscall spvtools::opt::CodeMetrics::Analyze(CodeMetrics *this,Loop *loop)

{
  IRContext *this_00;
  mapped_type pBVar1;
  mapped_type mVar2;
  CodeMetrics *pCVar3;
  char cVar4;
  uint32_t uVar5;
  mapped_type *ppBVar6;
  mapped_type *pmVar7;
  Instruction *inst;
  Instruction *pIVar8;
  _Hash_node_base *p_Var9;
  size_t bb_size;
  mapped_type local_a0;
  _Any_data *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  CFG *local_70;
  CodeMetrics *local_68;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this_00 = loop->context_;
  local_68 = this;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  local_70 = (this_00->cfg_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
             super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_68->roi_size_ = 0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_68);
  p_Var9 = (loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    local_70 = (CFG *)&local_70->id2block_;
    do {
      local_98 = (_Any_data *)CONCAT44(local_98._4_4_,*(undefined4 *)&p_Var9[1]._M_nxt);
      ppBVar6 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)local_70,(key_type *)&local_98);
      pBVar1 = *ppBVar6;
      local_a0 = 0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = &local_a0;
      pcStack_40 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:681:21)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:681:21)>
                 ::_M_manager;
      uStack_90 = 0;
      local_98 = &local_58;
      pcStack_80 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:306:7)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:306:7)>
                 ::_M_manager;
      pIVar8 = (pBVar1->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar8 != (Instruction *)0x0) {
        local_60._M_head_impl = pIVar8;
        std::
        _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:681:21)>
        ::_M_invoke(local_98,&local_60._M_head_impl);
      }
      for (pIVar8 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar8 != &(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_60._M_head_impl = pIVar8;
        if (local_88 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar4 = (*pcStack_80)(&local_98,&local_60);
        if (cVar4 == '\0') break;
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      mVar2 = local_a0;
      pIVar8 = (pBVar1->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar5 = 0;
      if (pIVar8->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      pCVar3 = local_68;
      local_98 = (_Any_data *)CONCAT44(local_98._4_4_,uVar5);
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_68,(key_type *)&local_98);
      *pmVar7 = mVar2;
      pCVar3->roi_size_ = pCVar3->roi_size_ + local_a0;
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CodeMetrics::Analyze(const Loop& loop) {
  CFG& cfg = *loop.GetContext()->cfg();

  roi_size_ = 0;
  block_sizes_.clear();

  for (uint32_t id : loop.GetBlocks()) {
    const BasicBlock* bb = cfg.block(id);
    size_t bb_size = 0;
    bb->ForEachInst([&bb_size](const Instruction* insn) {
      if (insn->opcode() == spv::Op::OpLabel) return;
      if (insn->IsNop()) return;
      if (insn->opcode() == spv::Op::OpPhi) return;
      bb_size++;
    });
    block_sizes_[bb->id()] = bb_size;
    roi_size_ += bb_size;
  }
}